

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O1

void boost::detail::function::functor_manager<void_(*)(const_boost::debug::dbg_startup_info_&)>::
     manage(function_buffer *in_buffer,function_buffer *out_buffer,functor_manager_operation_type op
           )

{
  int iVar1;
  char *__s1;
  
  switch(op) {
  case clone_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    break;
  case move_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)in_buffer = 0;
    break;
  case check_functor_type_tag:
    __s1 = *(char **)(*(long *)out_buffer + 8) + (**(char **)(*(long *)out_buffer + 8) == '*');
    if ((__s1 == "PFvRKN5boost5debug16dbg_startup_infoEE") ||
       (iVar1 = strcmp(__s1,"PFvRKN5boost5debug16dbg_startup_infoEE"), iVar1 == 0)) {
      *(function_buffer **)out_buffer = in_buffer;
      return;
    }
  case destroy_functor_tag:
    *(undefined8 *)out_buffer = 0;
    break;
  default:
    *(pointer_____offset_0x10___ **)out_buffer =
         &(*)(boost::debug::dbg_startup_info_const&)::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }